

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

qpdf_offset_t __thiscall
QPDF::processXRefStream(QPDF *this,qpdf_offset_t xref_offset,QPDFObjectHandle *xref_obj)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte bVar3;
  undefined8 f1;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  size_t j;
  size_t __val;
  long *plVar8;
  QPDFObjGen *pQVar9;
  byte *pbVar10;
  pointer ppVar11;
  long lVar12;
  longlong lVar13;
  QPDFExc *pQVar14;
  int iVar15;
  ulong uVar16;
  long *plVar17;
  QPDFObjGen QVar18;
  size_t sVar19;
  type ii;
  pointer pcVar20;
  char cVar21;
  _Any_data *dict_00;
  _Any_data *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var23;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var24;
  ulong uVar25;
  pair<int,_int> pVar26;
  pair<int,_std::array<int,_3UL>_> pVar27;
  string_view msg;
  QPDFObjectHandle dict;
  string __str_1;
  anon_class_16_2_099dce64 damaged;
  shared_ptr<Buffer> bp;
  QPDFExc x;
  string __str;
  undefined1 local_258 [16];
  undefined1 local_248 [24];
  string local_230;
  uint local_210;
  undefined4 uStack_20c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208 [2];
  QPDFObjGen local_1f8;
  QPDFObjGen local_1f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  QPDFObjGen QStack_1e0;
  anon_class_16_2_099dce64 local_1d8;
  QPDFObjectHandle local_1c8;
  undefined1 local_1b8 [128];
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_138;
  pointer local_118;
  pointer local_110;
  qpdf_offset_t local_108;
  ulong local_100;
  void *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  uint local_c0;
  long local_b8 [2];
  pair<int,_std::array<int,_3UL>_> local_a8;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  this_00 = (_Any_data *)&local_230;
  local_1d8.this = this;
  local_1d8.xref_offset = xref_offset;
  local_108 = xref_offset;
  QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_230);
  local_58._M_unused._M_object = local_1d8.this;
  local_58._8_8_ = local_1d8.xref_offset;
  local_40 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDF_objects.cc:907:20)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDF_objects.cc:907:20)>
             ::_M_manager;
  pVar27 = processXRefW((QPDF *)this_00,(QPDFObjectHandle *)&local_230,
                        (function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *
                        )&local_58);
  local_a8 = pVar27;
  if (local_48 != (code *)0x0) {
    this_00 = &local_58;
    (*local_48)(this_00,this_00,__destroy_functor);
  }
  local_78._M_unused._M_object = local_1d8.this;
  local_78._8_8_ = local_1d8.xref_offset;
  local_60 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDF_objects.cc:907:20)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDF_objects.cc:907:20)>
             ::_M_manager;
  dict_00 = (_Any_data *)&local_230;
  iVar15 = pVar27.first;
  iVar7 = processXRefSize((QPDF *)this_00,(QPDFObjectHandle *)dict_00,iVar15,
                          (function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>
                           *)&local_78);
  if (local_68 != (code *)0x0) {
    dict_00 = &local_78;
    (*local_68)(dict_00,dict_00,__destroy_functor);
  }
  local_98._M_unused._M_object = local_1d8.this;
  local_98._8_8_ = local_1d8.xref_offset;
  local_80 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDF_objects.cc:907:20)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDF_objects.cc:907:20)>
             ::_M_manager;
  processXRefIndex(&local_138,(QPDF *)dict_00,(QPDFObjectHandle *)&local_230,iVar7,
                   (function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *)
                   &local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  QPDFObjectHandle::getStreamData(&local_1c8,(qpdf_stream_decode_level_e)xref_obj);
  __val = Buffer::getSize((Buffer *)
                          local_1c8.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar15 < 0) {
    QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar15);
  }
  if (local_138.first < 0) {
    QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(local_138.first);
  }
  uVar25 = (long)local_138.first * (long)iVar15;
  local_230.field_2._M_allocated_capacity = pVar27._0_8_;
  if (uVar25 - __val != 0) {
    cVar21 = '\x01';
    if (9 < uVar25) {
      uVar16 = uVar25;
      cVar5 = '\x04';
      do {
        cVar21 = cVar5;
        if (uVar16 < 100) {
          cVar21 = cVar21 + -2;
          goto LAB_0022a036;
        }
        if (uVar16 < 1000) {
          cVar21 = cVar21 + -1;
          goto LAB_0022a036;
        }
        if (uVar16 < 10000) goto LAB_0022a036;
        bVar6 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar5 = cVar21 + '\x04';
      } while (bVar6);
      cVar21 = cVar21 + '\x01';
    }
LAB_0022a036:
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct((ulong)&local_c8,cVar21);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c8,local_c0,uVar25);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x27fc02);
    plVar17 = plVar8 + 2;
    if ((long *)*plVar8 == plVar17) {
      local_d8 = *plVar17;
      lStack_d0 = plVar8[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *plVar17;
      local_e8 = (long *)*plVar8;
    }
    local_e0 = plVar8[1];
    *plVar8 = (long)plVar17;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    pQVar9 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_e8);
    QVar18 = (QPDFObjGen)(pQVar9 + 2);
    if (*pQVar9 == QVar18) {
      local_1e8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)QVar18;
      QStack_1e0 = pQVar9[3];
      local_1f8 = (QPDFObjGen)&local_1e8;
    }
    else {
      local_1e8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)QVar18;
      local_1f8 = *pQVar9;
    }
    local_1f0 = pQVar9[1];
    *pQVar9 = QVar18;
    pQVar9[1].obj = 0;
    pQVar9[1].gen = 0;
    *(undefined1 *)&pQVar9[2].obj = 0;
    cVar21 = '\x01';
    if (9 < __val) {
      sVar19 = __val;
      cVar5 = '\x04';
      do {
        cVar21 = cVar5;
        if (sVar19 < 100) {
          cVar21 = cVar21 + -2;
          goto LAB_0022a189;
        }
        if (sVar19 < 1000) {
          cVar21 = cVar21 + -1;
          goto LAB_0022a189;
        }
        if (sVar19 < 10000) goto LAB_0022a189;
        bVar6 = 99999 < sVar19;
        sVar19 = sVar19 / 10000;
        cVar5 = cVar21 + '\x04';
      } while (bVar6);
      cVar21 = cVar21 + '\x01';
    }
LAB_0022a189:
    local_230.field_2._8_8_ = local_208;
    std::__cxx11::string::_M_construct((ulong)((long)&local_230.field_2 + 8),cVar21);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_230.field_2._8_8_,local_210,__val);
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (CONCAT44(uStack_20c,local_210) + (long)local_1f0);
    p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if (local_1f8 != (QPDFObjGen)&local_1e8) {
      p_Var22 = local_1e8;
    }
    if (p_Var22 < p_Var2) {
      _Var23._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_230.field_2._8_8_ != local_208) {
        _Var23._M_pi = local_208[0]._M_pi;
      }
      if (_Var23._M_pi < p_Var2) goto LAB_0022a1f4;
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)((long)&local_230.field_2 + 8),0,(char *)0x0,
                                  (ulong)local_1f8);
    }
    else {
LAB_0022a1f4:
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_1f8,local_230.field_2._8_8_);
    }
    local_258._0_8_ = local_248;
    peVar1 = (element_type *)(plVar8 + 2);
    if ((element_type *)*plVar8 == peVar1) {
      local_248._0_8_ =
           *(undefined8 *)
            &(peVar1->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_248._8_8_ = plVar8[3];
    }
    else {
      local_248._0_8_ =
           *(undefined8 *)
            &(peVar1->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_258._0_8_ = (element_type *)*plVar8;
    }
    local_258._8_8_ = plVar8[1];
    *plVar8 = (long)peVar1;
    plVar8[1] = 0;
    *(undefined1 *)
     &(peVar1->value).
      super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
         = 0;
    msg._M_str = (char *)peVar1;
    msg._M_len = local_258._0_8_;
    processXRefStream::anon_class_16_2_099dce64::operator()((QPDFExc *)local_1b8,&local_1d8,msg);
    if ((element_type *)local_258._0_8_ != (element_type *)local_248) {
      operator_delete((void *)local_258._0_8_,local_248._0_8_ + 1);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_230.field_2._8_8_ != local_208) {
      operator_delete((void *)local_230.field_2._8_8_,
                      (ulong)((long)&(local_208[0]._M_pi)->_vptr__Sp_counted_base + 1));
    }
    if (local_1f8 != (QPDFObjGen)&local_1e8) {
      operator_delete((void *)local_1f8,(ulong)((long)&local_1e8->_vptr__Sp_counted_base + 1));
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8,local_b8[0] + 1);
    }
    if (__val <= uVar25 && uVar25 - __val != 0) {
      pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
      QPDFExc::QPDFExc(pQVar14,(QPDFExc *)local_1b8);
      __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    warn(this,(QPDFExc *)local_1b8);
    QPDFExc::~QPDFExc((QPDFExc *)local_1b8);
  }
  pbVar10 = Buffer::getBuffer((Buffer *)
                              local_1c8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_118 = local_138.second.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
  if (local_138.second.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_138.second.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_248._16_8_ = 0;
    local_230.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity >> 0x20;
    ppVar11 = local_138.second.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      pVar26 = *ppVar11;
      local_100 = (ulong)pVar26 >> 0x20;
      local_110 = ppVar11;
      if (0 < pVar26.second) {
        iVar7 = 0;
        do {
          local_1b8._0_8_ = (pointer)0x0;
          local_1b8._8_8_ = 0;
          local_1b8._16_8_ = 0;
          if (local_230.field_2._M_allocated_capacity == 0) {
            local_1b8._0_8_ = (pointer)0x1;
          }
          local_1b8._1_7_ = 0;
          local_1b8[0] = local_230.field_2._M_allocated_capacity == 0;
          lVar12 = 0;
          do {
            iVar15 = local_a8.second._M_elems[lVar12];
            if (0 < iVar15) {
              uVar25 = *(ulong *)(local_1b8 + lVar12 * 8);
              do {
                *(ulong *)(local_1b8 + lVar12 * 8) = uVar25 << 8;
                bVar3 = *pbVar10;
                pbVar10 = pbVar10 + 1;
                uVar25 = uVar25 << 8 | (ulong)bVar3;
                *(ulong *)(local_1b8 + lVar12 * 8) = uVar25;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
            pcVar20 = (pointer)local_1b8._0_8_;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          uVar25 = local_248._16_8_ & 1;
          iVar15 = pVar26.first;
          local_248._16_8_ = (ulong)((pointer)local_1b8._0_8_ == (pointer)0x2);
          if (uVar25 == 0) {
LAB_0022a43b:
            if (iVar15 == 0) {
LAB_0022a4a8:
              ((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->first_xref_item_offset =
                   local_108;
            }
            else {
              if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
                if ((pointer)(local_1b8._0_8_ + -0x80000000) < (pointer)0xffffffff00000000) {
                  QIntC::IntConverter<long_long,_int,_true,_true>::error(local_1b8._0_8_);
                }
                goto LAB_0022a463;
              }
              insertFreeXrefEntry(this,(QPDFObjGen)((ulong)pVar26 & 0xffffffff));
            }
          }
          else {
            if ((pointer)local_1b8._0_8_ != (pointer)0x2) {
              _Var24._M_head_impl =
                   (this->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
              (_Var24._M_head_impl)->uncompressed_after_compressed = true;
              local_248._16_8_ = CONCAT71((int7)((ulong)_Var24._M_head_impl >> 8),1);
              goto LAB_0022a43b;
            }
            pcVar20 = (pointer)0x2;
            local_248._16_8_ = 1;
            if (iVar15 == 0) goto LAB_0022a4a8;
LAB_0022a463:
            uVar4 = local_1b8._16_8_;
            f1 = local_1b8._8_8_;
            if (local_1b8._16_8_ - 0x80000000 < 0xffffffff00000000) {
              QIntC::IntConverter<long_long,_int,_true,_true>::error(local_1b8._16_8_);
            }
            insertXrefEntry(this,iVar15,(int)pcVar20,f1,(int)uVar4);
          }
          pVar26.first = iVar15 + 1;
          pVar26.second = 0;
          iVar7 = iVar7 + 1;
        } while (iVar7 != (int)local_100);
      }
      ppVar11 = local_110 + 1;
    } while (ppVar11 != local_118);
  }
  _Var24._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(long *)&((_Var24._M_head_impl)->trailer).super_BaseHandle != 0) goto LAB_0022a571;
  local_f8 = local_230._M_dataplus._M_p;
  local_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0022a540:
    *(pointer *)&((_Var24._M_head_impl)->trailer).super_BaseHandle.obj = local_230._M_dataplus._M_p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&((_Var24._M_head_impl)->trailer).super_BaseHandle + 8),&local_f0);
  }
  else {
    if (__libc_single_threaded != '\0') {
      *(_Atomic_word *)(local_230._M_string_length + 8) =
           *(_Atomic_word *)(local_230._M_string_length + 8) + 1;
      goto LAB_0022a540;
    }
    LOCK();
    *(_Atomic_word *)(local_230._M_string_length + 8) =
         *(_Atomic_word *)(local_230._M_string_length + 8) + 1;
    UNLOCK();
    _Var24._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (*(long *)&((_Var24._M_head_impl)->trailer).super_BaseHandle.obj == 0) goto LAB_0022a540;
  }
  if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
  }
LAB_0022a571:
  pcVar20 = local_1b8 + 0x10;
  local_1b8._0_8_ = pcVar20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"/Prev","");
  bVar6 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_230,(string *)local_1b8);
  if ((pointer)local_1b8._0_8_ != pcVar20) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if (bVar6) {
    local_1b8._0_8_ = pcVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"/Prev","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_258,&local_230);
    bVar6 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_258);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
    }
    if ((pointer)local_1b8._0_8_ != pcVar20) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if (!bVar6) {
      pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_1b8._0_8_ = pcVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xref stream","");
      local_258._0_8_ = local_248;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,"/Prev key in xref stream dictionary is not an integer","");
      damagedPDF(pQVar14,this,(string *)local_1b8,(string *)local_258);
      __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    local_1b8._0_8_ = pcVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"/Prev","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_258,&local_230);
    lVar13 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_258);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
    }
    if ((pointer)local_1b8._0_8_ != pcVar20) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
  }
  else {
    lVar13 = 0;
  }
  if (local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_138.second.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.second.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.second.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.second.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length);
  }
  return lVar13;
}

Assistant:

qpdf_offset_t
QPDF::processXRefStream(qpdf_offset_t xref_offset, QPDFObjectHandle& xref_obj)
{
    auto damaged = [this, xref_offset](std::string_view msg) -> QPDFExc {
        return damagedPDF("xref stream", xref_offset, msg.data());
    };

    auto dict = xref_obj.getDict();

    auto [entry_size, W] = processXRefW(dict, damaged);
    int max_num_entries = processXRefSize(dict, entry_size, damaged);
    auto [num_entries, indx] = processXRefIndex(dict, max_num_entries, damaged);

    std::shared_ptr<Buffer> bp = xref_obj.getStreamData(qpdf_dl_specialized);
    size_t actual_size = bp->getSize();
    auto expected_size = toS(entry_size) * toS(num_entries);

    if (expected_size != actual_size) {
        QPDFExc x = damaged(
            "Cross-reference stream data has the wrong size; expected = " +
            std::to_string(expected_size) + "; actual = " + std::to_string(actual_size));
        if (expected_size > actual_size) {
            throw x;
        } else {
            warn(x);
        }
    }

    bool saw_first_compressed_object = false;

    // Actual size vs. expected size check above ensures that we will not overflow any buffers here.
    // We know that entry_size * num_entries is less or equal to the size of the buffer.
    auto p = bp->getBuffer();
    for (auto [obj, sec_entries]: indx) {
        // Process a subsection.
        for (int i = 0; i < sec_entries; ++i) {
            // Read this entry
            std::array<qpdf_offset_t, 3> fields{};
            if (W[0] == 0) {
                QTC::TC("qpdf", "QPDF default for xref stream field 0");
                fields[0] = 1;
            }
            for (size_t j = 0; j < 3; ++j) {
                for (int k = 0; k < W[j]; ++k) {
                    fields[j] <<= 8;
                    fields[j] |= *p++;
                }
            }

            // Get the generation number.  The generation number is 0 unless this is an uncompressed
            // object record, in which case the generation number appears as the third field.
            if (saw_first_compressed_object) {
                if (fields[0] != 2) {
                    m->uncompressed_after_compressed = true;
                }
            } else if (fields[0] == 2) {
                saw_first_compressed_object = true;
            }
            if (obj == 0) {
                // This is needed by checkLinearization()
                m->first_xref_item_offset = xref_offset;
            } else if (fields[0] == 0) {
                // Ignore fields[2], which we don't care about in this case. This works around the
                // issue of some PDF files that put invalid values, like -1, here for deleted
                // objects.
                insertFreeXrefEntry(QPDFObjGen(obj, 0));
            } else {
                insertXrefEntry(obj, toI(fields[0]), fields[1], toI(fields[2]));
            }
            ++obj;
        }
    }

    if (!m->trailer) {
        setTrailer(dict);
    }

    if (dict.hasKey("/Prev")) {
        if (!dict.getKey("/Prev").isInteger()) {
            throw damagedPDF(
                "xref stream", "/Prev key in xref stream dictionary is not an integer");
        }
        QTC::TC("qpdf", "QPDF prev key in xref stream dictionary");
        return dict.getKey("/Prev").getIntValue();
    } else {
        return 0;
    }
}